

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O3

bool embree::avx::FlatLinearCurveMiMBIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  Scene *pSVar22;
  ulong uVar23;
  undefined4 uVar24;
  long lVar25;
  ulong uVar26;
  float fVar27;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar38;
  float fVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar41 [32];
  float fVar48;
  float fVar49;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar73 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar82 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<8> hit;
  int local_31c;
  Primitive *local_318;
  RayQueryContext *local_310;
  Scene *local_308;
  Ray *local_300;
  ulong local_2f8;
  ulong local_2f0;
  Precalculations *local_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  uint local_29c;
  uint local_298;
  uint local_294;
  uint local_290;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  RTCFilterFunctionNArguments local_1d0;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  
  local_300 = ray;
  local_310 = context;
  pSVar22 = context->scene;
  uVar2 = line->sharedGeomID;
  uVar3 = (line->v0).field_0.i[0];
  local_2f0 = (ulong)uVar3;
  local_308 = pSVar22;
  pGVar11 = (pSVar22->geometries).items[uVar2].ptr;
  fVar27 = (pGVar11->time_range).lower;
  fVar27 = pGVar11->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar27) / ((pGVar11->time_range).upper - fVar27));
  auVar39 = vroundss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),9);
  auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar39 = vmaxss_avx(ZEXT816(0),auVar39);
  lVar12 = *(long *)&pGVar11[3].time_range.upper;
  lVar21 = (long)(int)auVar39._0_4_ * 0x38;
  lVar13 = *(long *)(lVar12 + lVar21);
  lVar25 = *(long *)(lVar12 + 0x10 + lVar21);
  uVar4 = (line->v0).field_0.i[4];
  local_2f8 = (ulong)uVar4;
  puVar1 = (undefined8 *)(lVar13 + lVar25 * local_2f8);
  uStack_210 = *puVar1;
  _local_220 = *(undefined1 (*) [16])(lVar13 + lVar25 * local_2f0);
  uStack_208 = puVar1[1];
  uVar5 = (line->v0).field_0.i[1];
  uVar6 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[3];
  uVar8 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar13 + lVar25 * (ulong)uVar8);
  uStack_270 = *puVar1;
  _local_280 = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)uVar5);
  uStack_268 = puVar1[1];
  uVar9 = (line->v0).field_0.i[6];
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)uVar9);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)uVar6);
  uVar10 = (line->v0).field_0.i[7];
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)uVar10);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)uVar7);
  local_2e8 = pre;
  uVar26 = (ulong)(uVar3 + 1);
  uVar23 = (ulong)(uVar4 + 1);
  auVar69._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * uVar23);
  auVar69._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * uVar26);
  auVar71._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)(uVar8 + 1));
  auVar71._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)(uVar5 + 1));
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)(uVar9 + 1));
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)(uVar6 + 1));
  auVar80._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)(uVar10 + 1));
  auVar80._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar25 * (ulong)(uVar7 + 1));
  lVar13 = *(long *)(lVar12 + 0x38 + lVar21);
  lVar12 = *(long *)(lVar12 + 0x48 + lVar21);
  auVar87._16_16_ = *(undefined1 (*) [16])(lVar13 + local_2f8 * lVar12);
  auVar87._0_16_ = *(undefined1 (*) [16])(lVar13 + local_2f0 * lVar12);
  auVar93._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar8 * lVar12);
  auVar93._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * lVar12);
  auVar60._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * lVar12);
  auVar60._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * lVar12);
  auVar50._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar10 * lVar12);
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar7 * lVar12);
  fVar27 = fVar27 - auVar39._0_4_;
  auVar17 = vunpcklps_avx(_local_220,auVar64);
  auVar15 = vunpckhps_avx(_local_220,auVar64);
  auVar91 = vunpcklps_avx(_local_280,auVar66);
  auVar16 = vunpckhps_avx(_local_280,auVar66);
  auVar30 = vunpcklps_avx(auVar17,auVar91);
  auVar17 = vunpckhps_avx(auVar17,auVar91);
  auVar31 = vunpcklps_avx(auVar15,auVar16);
  auVar15 = vunpckhps_avx(auVar15,auVar16);
  auVar90 = vunpcklps_avx(auVar69,auVar73);
  auVar16 = vunpckhps_avx(auVar69,auVar73);
  auVar18 = vunpcklps_avx(auVar71,auVar80);
  auVar91 = vunpckhps_avx(auVar71,auVar80);
  auVar41 = vunpcklps_avx(auVar90,auVar18);
  auVar90 = vunpckhps_avx(auVar90,auVar18);
  auVar52 = vunpcklps_avx(auVar16,auVar91);
  auVar16 = vunpckhps_avx(auVar16,auVar91);
  auVar19 = vunpcklps_avx(auVar87,auVar60);
  auVar91 = vunpckhps_avx(auVar87,auVar60);
  auVar28 = vunpcklps_avx(auVar93,auVar50);
  auVar18 = vunpckhps_avx(auVar93,auVar50);
  auVar50 = vunpcklps_avx(auVar19,auVar28);
  auVar19 = vunpckhps_avx(auVar19,auVar28);
  auVar60 = vunpcklps_avx(auVar91,auVar18);
  auVar91 = vunpckhps_avx(auVar91,auVar18);
  lVar25 = (ulong)(uVar8 + 1) * lVar12;
  auVar51._16_16_ = *(undefined1 (*) [16])(lVar13 + uVar23 * lVar12);
  auVar51._0_16_ = *(undefined1 (*) [16])(lVar13 + uVar26 * lVar12);
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar25);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * lVar12);
  auVar28._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar9 + 1) * lVar12);
  auVar28._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * lVar12);
  auVar88._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar12 * (ulong)(uVar10 + 1));
  auVar88._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * lVar12);
  auVar29 = vunpcklps_avx(auVar51,auVar28);
  auVar18 = vunpckhps_avx(auVar51,auVar28);
  auVar51 = vunpcklps_avx(auVar61,auVar88);
  auVar28 = vunpckhps_avx(auVar61,auVar88);
  auVar61 = vunpcklps_avx(auVar29,auVar51);
  auVar29 = vunpckhps_avx(auVar29,auVar51);
  auVar51 = vunpcklps_avx(auVar18,auVar28);
  auVar18 = vunpckhps_avx(auVar18,auVar28);
  auVar39 = vshufps_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),0);
  auVar40 = vshufps_avx(ZEXT416((uint)(1.0 - fVar27)),ZEXT416((uint)(1.0 - fVar27)),0);
  fVar32 = auVar39._0_4_;
  fVar33 = auVar39._4_4_;
  fVar34 = auVar39._8_4_;
  fVar35 = auVar39._12_4_;
  fVar36 = auVar40._0_4_;
  fVar37 = auVar40._4_4_;
  fVar38 = auVar40._8_4_;
  fVar42 = auVar40._12_4_;
  local_160._0_4_ = fVar36 * auVar30._0_4_ + fVar32 * auVar50._0_4_;
  local_160._4_4_ = fVar37 * auVar30._4_4_ + fVar33 * auVar50._4_4_;
  local_160._8_4_ = fVar38 * auVar30._8_4_ + fVar34 * auVar50._8_4_;
  local_160._12_4_ = fVar42 * auVar30._12_4_ + fVar35 * auVar50._12_4_;
  local_160._16_4_ = fVar36 * auVar30._16_4_ + fVar32 * auVar50._16_4_;
  local_160._20_4_ = fVar37 * auVar30._20_4_ + fVar33 * auVar50._20_4_;
  local_160._24_4_ = fVar38 * auVar30._24_4_ + fVar34 * auVar50._24_4_;
  local_160._28_4_ = auVar50._28_4_ + 0.0;
  local_180._0_4_ = fVar36 * auVar17._0_4_ + auVar19._0_4_ * fVar32;
  local_180._4_4_ = fVar37 * auVar17._4_4_ + auVar19._4_4_ * fVar33;
  local_180._8_4_ = fVar38 * auVar17._8_4_ + auVar19._8_4_ * fVar34;
  local_180._12_4_ = fVar42 * auVar17._12_4_ + auVar19._12_4_ * fVar35;
  local_180._16_4_ = fVar36 * auVar17._16_4_ + auVar19._16_4_ * fVar32;
  local_180._20_4_ = fVar37 * auVar17._20_4_ + auVar19._20_4_ * fVar33;
  local_180._24_4_ = fVar38 * auVar17._24_4_ + auVar19._24_4_ * fVar34;
  local_180._28_4_ = auVar50._28_4_ + 0.0;
  local_280._0_4_ = auVar31._0_4_;
  local_280._4_4_ = auVar31._4_4_;
  fStack_278 = auVar31._8_4_;
  fStack_274 = auVar31._12_4_;
  uStack_270._0_4_ = auVar31._16_4_;
  uStack_270._4_4_ = auVar31._20_4_;
  uStack_268._0_4_ = auVar31._24_4_;
  local_1a0._0_4_ = fVar36 * (float)local_280._0_4_ + auVar60._0_4_ * fVar32;
  local_1a0._4_4_ = fVar37 * (float)local_280._4_4_ + auVar60._4_4_ * fVar33;
  local_1a0._8_4_ = fVar38 * fStack_278 + auVar60._8_4_ * fVar34;
  local_1a0._12_4_ = fVar42 * fStack_274 + auVar60._12_4_ * fVar35;
  local_1a0._16_4_ = fVar36 * (float)uStack_270 + auVar60._16_4_ * fVar32;
  local_1a0._20_4_ = fVar37 * uStack_270._4_4_ + auVar60._20_4_ * fVar33;
  local_1a0._24_4_ = fVar38 * (float)uStack_268 + auVar60._24_4_ * fVar34;
  local_1a0._28_4_ = auVar28._28_4_ + 0.0;
  local_200._0_4_ = auVar15._0_4_;
  local_200._4_4_ = auVar15._4_4_;
  fStack_1f8 = auVar15._8_4_;
  fStack_1f4 = auVar15._12_4_;
  fStack_1f0 = auVar15._16_4_;
  fStack_1ec = auVar15._20_4_;
  fStack_1e8 = auVar15._24_4_;
  local_200._0_4_ = fVar36 * (float)local_200._0_4_ + auVar91._0_4_ * fVar32;
  local_200._4_4_ = fVar37 * (float)local_200._4_4_ + auVar91._4_4_ * fVar33;
  fStack_1f8 = fVar38 * fStack_1f8 + auVar91._8_4_ * fVar34;
  fStack_1f4 = fVar42 * fStack_1f4 + auVar91._12_4_ * fVar35;
  fStack_1f0 = fVar36 * fStack_1f0 + auVar91._16_4_ * fVar32;
  fStack_1ec = fVar37 * fStack_1ec + auVar91._20_4_ * fVar33;
  fStack_1e8 = fVar38 * fStack_1e8 + auVar91._24_4_ * fVar34;
  fStack_1e4 = auVar17._28_4_ + auVar28._28_4_;
  fVar27 = auVar41._28_4_;
  local_280._4_4_ = fVar37 * auVar41._4_4_ + auVar61._4_4_ * fVar33;
  local_280._0_4_ = fVar36 * auVar41._0_4_ + auVar61._0_4_ * fVar32;
  fStack_278 = fVar38 * auVar41._8_4_ + auVar61._8_4_ * fVar34;
  fStack_274 = fVar42 * auVar41._12_4_ + auVar61._12_4_ * fVar35;
  uStack_270._0_4_ = fVar36 * auVar41._16_4_ + auVar61._16_4_ * fVar32;
  uStack_270._4_4_ = fVar37 * auVar41._20_4_ + auVar61._20_4_ * fVar33;
  uStack_268._0_4_ = fVar38 * auVar41._24_4_ + auVar61._24_4_ * fVar34;
  uStack_268._4_4_ = fVar27 + fStack_1e4;
  local_260._0_4_ = auVar90._0_4_;
  local_260._4_4_ = auVar90._4_4_;
  fStack_258 = auVar90._8_4_;
  fStack_254 = auVar90._12_4_;
  fStack_250 = auVar90._16_4_;
  fStack_24c = auVar90._20_4_;
  fStack_248 = auVar90._24_4_;
  local_260._4_4_ = fVar37 * (float)local_260._4_4_ + auVar29._4_4_ * fVar33;
  local_260._0_4_ = fVar36 * (float)local_260._0_4_ + auVar29._0_4_ * fVar32;
  fStack_258 = fVar38 * fStack_258 + auVar29._8_4_ * fVar34;
  fStack_254 = fVar42 * fStack_254 + auVar29._12_4_ * fVar35;
  fStack_250 = fVar36 * fStack_250 + auVar29._16_4_ * fVar32;
  fStack_24c = fVar37 * fStack_24c + auVar29._20_4_ * fVar33;
  fStack_248 = fVar38 * fStack_248 + auVar29._24_4_ * fVar34;
  fStack_244 = fVar27 + auVar17._28_4_;
  local_240._0_4_ = auVar52._0_4_;
  local_240._4_4_ = auVar52._4_4_;
  fStack_238 = auVar52._8_4_;
  fStack_234 = auVar52._12_4_;
  fStack_230 = auVar52._16_4_;
  fStack_22c = auVar52._20_4_;
  fStack_228 = auVar52._24_4_;
  local_2e0 = fVar36 * (float)local_240._0_4_ + auVar51._0_4_ * fVar32;
  fStack_2dc = fVar37 * (float)local_240._4_4_ + auVar51._4_4_ * fVar33;
  fStack_2d8 = fVar38 * fStack_238 + auVar51._8_4_ * fVar34;
  fStack_2d4 = fVar42 * fStack_234 + auVar51._12_4_ * fVar35;
  fStack_2d0 = fVar36 * fStack_230 + auVar51._16_4_ * fVar32;
  fStack_2cc = fVar37 * fStack_22c + auVar51._20_4_ * fVar33;
  fStack_2c8 = fVar38 * fStack_228 + auVar51._24_4_ * fVar34;
  fStack_2c4 = fVar27 + auVar30._28_4_;
  local_220._0_4_ = auVar16._0_4_;
  local_220._4_4_ = auVar16._4_4_;
  fStack_218 = auVar16._8_4_;
  fStack_214 = auVar16._12_4_;
  uStack_210._0_4_ = auVar16._16_4_;
  uStack_210._4_4_ = auVar16._20_4_;
  uStack_208._0_4_ = auVar16._24_4_;
  auVar39 = vpcmpeqd_avx(auVar19._0_16_,auVar19._0_16_);
  auVar40 = vpcmpeqd_avx(auVar39,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  local_240._4_4_ = fVar37 * (float)local_220._4_4_ + auVar18._4_4_ * fVar33;
  local_240._0_4_ = fVar36 * (float)local_220._0_4_ + auVar18._0_4_ * fVar32;
  fStack_238 = fVar38 * fStack_218 + auVar18._8_4_ * fVar34;
  fStack_234 = fVar42 * fStack_214 + auVar18._12_4_ * fVar35;
  fStack_230 = fVar36 * (float)uStack_210 + auVar18._16_4_ * fVar32;
  fStack_22c = fVar37 * uStack_210._4_4_ + auVar18._20_4_ * fVar33;
  fStack_228 = fVar38 * (float)uStack_208 + auVar18._24_4_ * fVar34;
  fStack_224 = fVar27 + fVar35;
  local_318 = line;
  auVar39 = vpcmpeqd_avx(auVar39,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_130 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
  local_140 = local_130;
  fVar27 = (pre->ray_space).vy.field_0.m128[0];
  fVar32 = (pre->ray_space).vz.field_0.m128[0];
  uVar24 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar89._4_4_ = uVar24;
  auVar89._0_4_ = uVar24;
  auVar89._8_4_ = uVar24;
  auVar89._12_4_ = uVar24;
  auVar89._16_4_ = uVar24;
  auVar89._20_4_ = uVar24;
  auVar89._24_4_ = uVar24;
  auVar89._28_4_ = uVar24;
  register0x000012d0 = auVar39;
  _local_220 = auVar40;
  uVar24 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar92._4_4_ = uVar24;
  auVar92._0_4_ = uVar24;
  auVar92._8_4_ = uVar24;
  auVar92._12_4_ = uVar24;
  auVar92._16_4_ = uVar24;
  auVar92._20_4_ = uVar24;
  auVar92._24_4_ = uVar24;
  auVar92._28_4_ = uVar24;
  auVar15 = vsubps_avx(local_180,auVar89);
  auVar16 = vsubps_avx(local_1a0,auVar92);
  fVar77 = auVar16._0_4_;
  fVar78 = auVar16._4_4_;
  fVar79 = auVar16._8_4_;
  fVar83 = auVar16._12_4_;
  fVar84 = auVar16._16_4_;
  fVar85 = auVar16._20_4_;
  fVar86 = auVar16._24_4_;
  fVar43 = auVar15._0_4_;
  fVar46 = auVar15._4_4_;
  fVar49 = auVar15._8_4_;
  fVar55 = auVar15._12_4_;
  fVar57 = auVar15._16_4_;
  fVar72 = auVar15._20_4_;
  fVar75 = auVar15._24_4_;
  fVar33 = (pre->ray_space).vy.field_0.m128[1];
  auVar40 = vpermilps_avx((undefined1  [16])(pre->ray_space).vy.field_0,0xaa);
  fVar34 = (pre->ray_space).vz.field_0.m128[1];
  fVar35 = (pre->ray_space).vz.field_0.m128[2];
  fVar44 = auVar40._0_4_;
  fVar47 = auVar40._4_4_;
  fVar54 = auVar40._8_4_;
  fVar58 = auVar40._12_4_;
  fVar36 = (pre->ray_space).vx.field_0.m128[0];
  fVar37 = *(float *)&(ray->org).field_0;
  auVar70._4_4_ = fVar37;
  auVar70._0_4_ = fVar37;
  auVar70._8_4_ = fVar37;
  auVar70._12_4_ = fVar37;
  auVar70._16_4_ = fVar37;
  auVar70._20_4_ = fVar37;
  auVar70._24_4_ = fVar37;
  auVar70._28_4_ = fVar37;
  auVar17 = vsubps_avx(local_160,auVar70);
  fVar45 = auVar17._0_4_;
  fVar48 = auVar17._4_4_;
  fVar53 = auVar17._8_4_;
  fVar56 = auVar17._12_4_;
  fVar59 = auVar17._16_4_;
  fVar74 = auVar17._20_4_;
  fVar76 = auVar17._24_4_;
  auVar81._0_4_ = fVar36 * fVar45 + fVar27 * fVar43 + fVar77 * fVar32;
  auVar81._4_4_ = fVar36 * fVar48 + fVar27 * fVar46 + fVar78 * fVar32;
  auVar81._8_4_ = fVar36 * fVar53 + fVar27 * fVar49 + fVar79 * fVar32;
  auVar81._12_4_ = fVar36 * fVar56 + fVar27 * fVar55 + fVar83 * fVar32;
  auVar81._16_4_ = fVar36 * fVar59 + fVar27 * fVar57 + fVar84 * fVar32;
  auVar81._20_4_ = fVar36 * fVar74 + fVar27 * fVar72 + fVar85 * fVar32;
  auVar81._24_4_ = fVar36 * fVar76 + fVar27 * fVar75 + fVar86 * fVar32;
  auVar81._28_4_ = auVar15._28_4_ + auVar18._28_4_ + auVar61._28_4_;
  fVar38 = (pre->ray_space).vx.field_0.m128[1];
  auVar82._0_4_ = fVar38 * fVar45 + fVar33 * fVar43 + fVar77 * fVar34;
  auVar82._4_4_ = fVar38 * fVar48 + fVar33 * fVar46 + fVar78 * fVar34;
  auVar82._8_4_ = fVar38 * fVar53 + fVar33 * fVar49 + fVar79 * fVar34;
  auVar82._12_4_ = fVar38 * fVar56 + fVar33 * fVar55 + fVar83 * fVar34;
  auVar82._16_4_ = fVar38 * fVar59 + fVar33 * fVar57 + fVar84 * fVar34;
  auVar82._20_4_ = fVar38 * fVar74 + fVar33 * fVar72 + fVar85 * fVar34;
  auVar82._24_4_ = fVar38 * fVar76 + fVar33 * fVar75 + fVar86 * fVar34;
  auVar82._28_4_ = auVar16._28_4_ + auVar91._28_4_ + auVar39._12_4_;
  fVar42 = (pre->ray_space).vx.field_0.m128[2];
  auVar67._0_4_ = fVar42 * fVar45 + fVar43 * fVar44 + fVar35 * fVar77;
  auVar67._4_4_ = fVar42 * fVar48 + fVar46 * fVar47 + fVar35 * fVar78;
  auVar67._8_4_ = fVar42 * fVar53 + fVar49 * fVar54 + fVar35 * fVar79;
  auVar67._12_4_ = fVar42 * fVar56 + fVar55 * fVar58 + fVar35 * fVar83;
  auVar67._16_4_ = fVar42 * fVar59 + fVar57 * fVar44 + fVar35 * fVar84;
  auVar67._20_4_ = fVar42 * fVar74 + fVar72 * fVar47 + fVar35 * fVar85;
  auVar67._24_4_ = fVar42 * fVar76 + fVar75 * fVar54 + fVar35 * fVar86;
  auVar67._28_4_ = auVar17._28_4_ + auVar15._28_4_ + auVar16._28_4_;
  auVar19._4_4_ = fStack_2dc;
  auVar19._0_4_ = local_2e0;
  auVar19._8_4_ = fStack_2d8;
  auVar19._12_4_ = fStack_2d4;
  auVar19._16_4_ = fStack_2d0;
  auVar19._20_4_ = fStack_2cc;
  auVar19._24_4_ = fStack_2c8;
  auVar19._28_4_ = fStack_2c4;
  auVar15 = vsubps_avx(auVar19,auVar92);
  fVar43 = auVar15._0_4_;
  fVar48 = auVar15._4_4_;
  fVar55 = auVar15._8_4_;
  fVar59 = auVar15._12_4_;
  fVar75 = auVar15._16_4_;
  fVar78 = auVar15._20_4_;
  fVar84 = auVar15._24_4_;
  auVar16 = vsubps_avx(_local_260,auVar89);
  fVar45 = auVar16._0_4_;
  fVar49 = auVar16._4_4_;
  fVar56 = auVar16._8_4_;
  fVar72 = auVar16._12_4_;
  fVar76 = auVar16._16_4_;
  fVar79 = auVar16._20_4_;
  fVar85 = auVar16._24_4_;
  auVar16 = vsubps_avx(_local_280,auVar70);
  fVar46 = auVar16._0_4_;
  fVar53 = auVar16._4_4_;
  fVar57 = auVar16._8_4_;
  fVar74 = auVar16._12_4_;
  fVar77 = auVar16._16_4_;
  fVar83 = auVar16._20_4_;
  fVar86 = auVar16._24_4_;
  auVar29._0_4_ = fVar36 * fVar46 + fVar27 * fVar45 + fVar32 * fVar43;
  auVar29._4_4_ = fVar36 * fVar53 + fVar27 * fVar49 + fVar32 * fVar48;
  auVar29._8_4_ = fVar36 * fVar57 + fVar27 * fVar56 + fVar32 * fVar55;
  auVar29._12_4_ = fVar36 * fVar74 + fVar27 * fVar72 + fVar32 * fVar59;
  auVar29._16_4_ = fVar36 * fVar77 + fVar27 * fVar76 + fVar32 * fVar75;
  auVar29._20_4_ = fVar36 * fVar83 + fVar27 * fVar79 + fVar32 * fVar78;
  auVar29._24_4_ = fVar36 * fVar86 + fVar27 * fVar85 + fVar32 * fVar84;
  auVar29._28_4_ = fVar36 + fVar27 + fVar32;
  auVar52._0_4_ = fVar38 * fVar46 + fVar33 * fVar45 + fVar34 * fVar43;
  auVar52._4_4_ = fVar38 * fVar53 + fVar33 * fVar49 + fVar34 * fVar48;
  auVar52._8_4_ = fVar38 * fVar57 + fVar33 * fVar56 + fVar34 * fVar55;
  auVar52._12_4_ = fVar38 * fVar74 + fVar33 * fVar72 + fVar34 * fVar59;
  auVar52._16_4_ = fVar38 * fVar77 + fVar33 * fVar76 + fVar34 * fVar75;
  auVar52._20_4_ = fVar38 * fVar83 + fVar33 * fVar79 + fVar34 * fVar78;
  auVar52._24_4_ = fVar38 * fVar86 + fVar33 * fVar85 + fVar34 * fVar84;
  auVar52._28_4_ = fVar36 + fVar27 + fVar34;
  auVar41._0_4_ = fVar42 * fVar46 + fVar45 * fVar44 + fVar35 * fVar43;
  auVar41._4_4_ = fVar42 * fVar53 + fVar49 * fVar47 + fVar35 * fVar48;
  auVar41._8_4_ = fVar42 * fVar57 + fVar56 * fVar54 + fVar35 * fVar55;
  auVar41._12_4_ = fVar42 * fVar74 + fVar72 * fVar58 + fVar35 * fVar59;
  auVar41._16_4_ = fVar42 * fVar77 + fVar76 * fVar44 + fVar35 * fVar75;
  auVar41._20_4_ = fVar42 * fVar83 + fVar79 * fVar47 + fVar35 * fVar78;
  auVar41._24_4_ = fVar42 * fVar86 + fVar85 * fVar54 + fVar35 * fVar84;
  auVar41._28_4_ = fVar42 + fVar58 + auVar15._28_4_;
  auVar17 = vsubps_avx(auVar29,auVar81);
  auVar91 = vsubps_avx(auVar52,auVar82);
  fVar43 = auVar91._0_4_;
  fVar44 = auVar91._4_4_;
  auVar15._4_4_ = fVar44 * -auVar82._4_4_;
  auVar15._0_4_ = fVar43 * -auVar82._0_4_;
  fVar45 = auVar91._8_4_;
  auVar15._8_4_ = fVar45 * -auVar82._8_4_;
  fVar46 = auVar91._12_4_;
  auVar15._12_4_ = fVar46 * -auVar82._12_4_;
  fVar47 = auVar91._16_4_;
  auVar15._16_4_ = fVar47 * -auVar82._16_4_;
  fVar48 = auVar91._20_4_;
  auVar15._20_4_ = fVar48 * -auVar82._20_4_;
  fVar58 = auVar91._24_4_;
  auVar15._24_4_ = fVar58 * -auVar82._24_4_;
  auVar15._28_4_ = -auVar82._28_4_;
  fVar27 = auVar17._0_4_;
  fVar32 = auVar17._4_4_;
  auVar90._4_4_ = auVar81._4_4_ * fVar32;
  auVar90._0_4_ = auVar81._0_4_ * fVar27;
  fVar33 = auVar17._8_4_;
  auVar90._8_4_ = auVar81._8_4_ * fVar33;
  fVar34 = auVar17._12_4_;
  auVar90._12_4_ = auVar81._12_4_ * fVar34;
  fVar35 = auVar17._16_4_;
  auVar90._16_4_ = auVar81._16_4_ * fVar35;
  fVar38 = auVar17._20_4_;
  auVar90._20_4_ = auVar81._20_4_ * fVar38;
  fVar42 = auVar17._24_4_;
  auVar90._24_4_ = auVar81._24_4_ * fVar42;
  auVar90._28_4_ = fVar36;
  auVar90 = vsubps_avx(auVar15,auVar90);
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = 0x3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar65._16_4_ = 0x3f800000;
  auVar65._20_4_ = 0x3f800000;
  auVar65._24_4_ = 0x3f800000;
  auVar65._28_4_ = 0x3f800000;
  auVar68._0_4_ = fVar27 * fVar27 + fVar43 * fVar43;
  auVar68._4_4_ = fVar32 * fVar32 + fVar44 * fVar44;
  auVar68._8_4_ = fVar33 * fVar33 + fVar45 * fVar45;
  auVar68._12_4_ = fVar34 * fVar34 + fVar46 * fVar46;
  auVar68._16_4_ = fVar35 * fVar35 + fVar47 * fVar47;
  auVar68._20_4_ = fVar38 * fVar38 + fVar48 * fVar48;
  auVar68._24_4_ = fVar42 * fVar42 + fVar58 * fVar58;
  auVar68._28_4_ = fVar37 + auVar16._28_4_;
  auVar15 = vrcpps_avx(auVar68);
  fVar36 = auVar15._0_4_;
  fVar37 = auVar15._4_4_;
  auVar16._4_4_ = fVar37 * auVar68._4_4_;
  auVar16._0_4_ = fVar36 * auVar68._0_4_;
  fVar49 = auVar15._8_4_;
  auVar16._8_4_ = fVar49 * auVar68._8_4_;
  fVar53 = auVar15._12_4_;
  auVar16._12_4_ = fVar53 * auVar68._12_4_;
  fVar54 = auVar15._16_4_;
  auVar16._16_4_ = fVar54 * auVar68._16_4_;
  fVar55 = auVar15._20_4_;
  auVar16._20_4_ = fVar55 * auVar68._20_4_;
  fVar56 = auVar15._24_4_;
  auVar16._24_4_ = fVar56 * auVar68._24_4_;
  auVar16._28_4_ = auVar68._28_4_;
  auVar15 = vsubps_avx(auVar65,auVar16);
  auVar18._4_4_ = auVar90._4_4_ * (fVar37 + fVar37 * auVar15._4_4_);
  auVar18._0_4_ = auVar90._0_4_ * (fVar36 + fVar36 * auVar15._0_4_);
  auVar18._8_4_ = auVar90._8_4_ * (fVar49 + fVar49 * auVar15._8_4_);
  auVar18._12_4_ = auVar90._12_4_ * (fVar53 + fVar53 * auVar15._12_4_);
  auVar18._16_4_ = auVar90._16_4_ * (fVar54 + fVar54 * auVar15._16_4_);
  auVar18._20_4_ = auVar90._20_4_ * (fVar55 + fVar55 * auVar15._20_4_);
  auVar18._24_4_ = auVar90._24_4_ * (fVar56 + fVar56 * auVar15._24_4_);
  auVar18._28_4_ = auVar90._28_4_;
  auVar15 = vminps_avx(auVar18,auVar65);
  auVar90 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_120 = vmaxps_avx(auVar15,auVar90);
  fVar72 = local_120._0_4_;
  fVar74 = local_120._4_4_;
  fVar75 = local_120._8_4_;
  fVar76 = local_120._12_4_;
  fVar77 = local_120._16_4_;
  fVar78 = local_120._20_4_;
  fVar79 = local_120._24_4_;
  fVar27 = auVar81._0_4_ + fVar72 * fVar27;
  fVar32 = auVar81._4_4_ + fVar74 * fVar32;
  fVar33 = auVar81._8_4_ + fVar75 * fVar33;
  fVar34 = auVar81._12_4_ + fVar76 * fVar34;
  fVar35 = auVar81._16_4_ + fVar77 * fVar35;
  fVar36 = auVar81._20_4_ + fVar78 * fVar38;
  fVar37 = auVar81._24_4_ + fVar79 * fVar42;
  fVar49 = auVar82._0_4_ + fVar72 * fVar43;
  fVar53 = auVar82._4_4_ + fVar74 * fVar44;
  fVar54 = auVar82._8_4_ + fVar75 * fVar45;
  fVar55 = auVar82._12_4_ + fVar76 * fVar46;
  fVar56 = auVar82._16_4_ + fVar77 * fVar47;
  fVar57 = auVar82._20_4_ + fVar78 * fVar48;
  fVar58 = auVar82._24_4_ + fVar79 * fVar58;
  fVar59 = auVar82._28_4_ + auVar91._28_4_;
  auVar15 = vsubps_avx(auVar41,auVar67);
  local_e0._0_4_ = auVar67._0_4_ + fVar72 * auVar15._0_4_;
  local_e0._4_4_ = auVar67._4_4_ + fVar74 * auVar15._4_4_;
  local_e0._8_4_ = auVar67._8_4_ + fVar75 * auVar15._8_4_;
  local_e0._12_4_ = auVar67._12_4_ + fVar76 * auVar15._12_4_;
  local_e0._16_4_ = auVar67._16_4_ + fVar77 * auVar15._16_4_;
  local_e0._20_4_ = auVar67._20_4_ + fVar78 * auVar15._20_4_;
  local_e0._24_4_ = auVar67._24_4_ + fVar79 * auVar15._24_4_;
  local_e0._28_4_ = auVar67._28_4_ + auVar15._28_4_;
  auVar15 = vsubps_avx(_local_240,_local_200);
  fVar38 = (float)local_200._0_4_ + fVar72 * auVar15._0_4_;
  fVar42 = (float)local_200._4_4_ + fVar74 * auVar15._4_4_;
  fVar43 = fStack_1f8 + fVar75 * auVar15._8_4_;
  fVar44 = fStack_1f4 + fVar76 * auVar15._12_4_;
  fVar45 = fStack_1f0 + fVar77 * auVar15._16_4_;
  fVar46 = fStack_1ec + fVar78 * auVar15._20_4_;
  fVar47 = fStack_1e8 + fVar79 * auVar15._24_4_;
  fVar48 = fStack_1e4 + auVar15._28_4_;
  auVar30._0_4_ = fVar27 * fVar27 + fVar49 * fVar49;
  auVar30._4_4_ = fVar32 * fVar32 + fVar53 * fVar53;
  auVar30._8_4_ = fVar33 * fVar33 + fVar54 * fVar54;
  auVar30._12_4_ = fVar34 * fVar34 + fVar55 * fVar55;
  auVar30._16_4_ = fVar35 * fVar35 + fVar56 * fVar56;
  auVar30._20_4_ = fVar36 * fVar36 + fVar57 * fVar57;
  auVar30._24_4_ = fVar37 * fVar37 + fVar58 * fVar58;
  auVar30._28_4_ = auVar81._28_4_ + auVar17._28_4_ + fVar59;
  auVar17._4_4_ = fVar42 * fVar42;
  auVar17._0_4_ = fVar38 * fVar38;
  auVar17._8_4_ = fVar43 * fVar43;
  auVar17._12_4_ = fVar44 * fVar44;
  auVar17._16_4_ = fVar45 * fVar45;
  auVar17._20_4_ = fVar46 * fVar46;
  auVar17._24_4_ = fVar47 * fVar47;
  auVar17._28_4_ = fVar59;
  uVar24 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar62._4_4_ = uVar24;
  auVar62._0_4_ = uVar24;
  auVar62._8_4_ = uVar24;
  auVar62._12_4_ = uVar24;
  auVar62._16_4_ = uVar24;
  auVar62._20_4_ = uVar24;
  auVar62._24_4_ = uVar24;
  auVar62._28_4_ = uVar24;
  auVar16 = vcmpps_avx(auVar30,auVar17,2);
  auVar15 = vcmpps_avx(auVar62,local_e0,2);
  fVar27 = ray->tfar;
  auVar63._4_4_ = fVar27;
  auVar63._0_4_ = fVar27;
  auVar63._8_4_ = fVar27;
  auVar63._12_4_ = fVar27;
  auVar63._16_4_ = fVar27;
  auVar63._20_4_ = fVar27;
  auVar63._24_4_ = fVar27;
  auVar63._28_4_ = fVar27;
  auVar17 = vcmpps_avx(local_e0,auVar63,2);
  auVar15 = vandps_avx(auVar17,auVar15);
  fVar27 = pre->depth_scale;
  auVar15 = vandps_avx(auVar15,auVar16);
  auVar91._4_4_ = fVar27 * (fVar42 + fVar42);
  auVar91._0_4_ = fVar27 * (fVar38 + fVar38);
  auVar91._8_4_ = fVar27 * (fVar43 + fVar43);
  auVar91._12_4_ = fVar27 * (fVar44 + fVar44);
  auVar91._16_4_ = fVar27 * (fVar45 + fVar45);
  auVar91._20_4_ = fVar27 * (fVar46 + fVar46);
  auVar91._24_4_ = fVar27 * (fVar47 + fVar47);
  auVar91._28_4_ = fVar48 + fVar48;
  auVar16 = vcmpps_avx(local_e0,auVar91,6);
  auVar15 = vandps_avx(auVar16,auVar15);
  auVar39 = vpslld_avx(auVar15._0_16_,0x1f);
  auVar40 = vpsrad_avx(auVar39,0x1f);
  auVar39 = vpslld_avx(auVar15._16_16_,0x1f);
  auVar39 = vpsrad_avx(auVar39,0x1f);
  auVar31._16_16_ = auVar39;
  auVar31._0_16_ = auVar40;
  auVar15 = auVar31 & ~_local_220;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vandnps_avx(_local_220,auVar31);
    local_c0 = vsubps_avx(_local_280,local_160);
    local_a0 = vsubps_avx(_local_260,local_180);
    auVar20._4_4_ = fStack_2dc;
    auVar20._0_4_ = local_2e0;
    auVar20._8_4_ = fStack_2d8;
    auVar20._12_4_ = fStack_2d4;
    auVar20._16_4_ = fStack_2d0;
    auVar20._20_4_ = fStack_2cc;
    auVar20._24_4_ = fStack_2c8;
    auVar20._28_4_ = fStack_2c4;
    local_80[0] = vsubps_avx(auVar20,local_1a0);
    auVar16 = vcmpps_avx(auVar90,local_c0,4);
    auVar91 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar17 = vcmpps_avx(auVar91,local_a0,4);
    auVar17 = vorps_avx(auVar16,auVar17);
    auVar16 = vcmpps_avx(auVar91,local_80[0],4);
    auVar16 = vorps_avx(auVar17,auVar16);
    auVar17 = auVar15 & auVar16;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      local_2e0 = ray->tfar;
      auVar15 = vandps_avx(auVar16,auVar15);
      local_100 = ZEXT832(0) << 0x20;
      uVar24 = vmovmskps_avx(auVar15);
      uVar26 = CONCAT44((int)((ulong)lVar25 >> 0x20),uVar24);
      do {
        local_1d0.valid = &local_31c;
        uVar23 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        pGVar11 = (pSVar22->geometries).items[*(uint *)(local_140 + uVar23 * 4)].ptr;
        if ((pGVar11->mask & ray->mask) != 0) {
          if ((local_310->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_2b0 = *(undefined4 *)(local_c0 + uVar23 * 4);
          local_2ac = *(undefined4 *)(local_a0 + uVar23 * 4);
          local_2a8 = *(undefined4 *)(local_80[0] + uVar23 * 4);
          local_2a4 = *(undefined4 *)(local_120 + uVar23 * 4);
          local_2a0 = *(undefined4 *)(local_100 + uVar23 * 4);
          local_29c = (local_318->primIDs).field_0.i[uVar23];
          local_298 = *(uint *)(local_140 + uVar23 * 4);
          local_294 = local_310->user->instID[0];
          local_290 = local_310->user->instPrimID[0];
          ray->tfar = *(float *)(local_e0 + uVar23 * 4);
          local_31c = -1;
          local_1d0.geometryUserPtr = pGVar11->userPtr;
          local_1d0.context = local_310->user;
          local_1d0.N = 1;
          local_1d0.ray = (RTCRayN *)ray;
          local_1d0.hit = (RTCHitN *)&local_2b0;
          if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar11->occlusionFilterN)(&local_1d0), *local_1d0.valid != 0)) {
            p_Var14 = local_310->args->filter;
            if ((p_Var14 == (RTCFilterFunctionN)0x0) ||
               ((((local_310->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar11->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var14)(&local_1d0), *local_1d0.valid != 0)))) {
              return true;
            }
          }
          local_300->tfar = local_2e0;
          pSVar22 = local_308;
          ray = local_300;
        }
        uVar26 = uVar26 ^ 1L << (uVar23 & 0x3f);
      } while (uVar26 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom,ray.time());
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }